

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Aggregator.cpp
# Opt level: O0

void __thiscall cali::Aggregator::~Aggregator(Aggregator *this)

{
  Aggregator *this_local;
  
  std::__shared_ptr<cali::Aggregator::AggregatorImpl,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<cali::Aggregator::AggregatorImpl,_(__gnu_cxx::_Lock_policy)2> *)this);
  std::shared_ptr<cali::Aggregator::AggregatorImpl>::~shared_ptr(&this->mP);
  return;
}

Assistant:

Aggregator::~Aggregator()
{
    mP.reset();
}